

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamio.c
# Opt level: O2

StreamIn * prvTidyFileInput(TidyDocImpl *doc,FILE *fp,int encoding)

{
  int iVar1;
  StreamIn *in;
  
  in = prvTidyinitStreamIn(doc,encoding);
  iVar1 = prvTidyinitFileSource(doc->allocator,&in->source,fp);
  if (iVar1 == 0) {
    in->iotype = FileIO;
  }
  else {
    prvTidyfreeStreamIn(in);
    in = (StreamIn *)0x0;
  }
  return in;
}

Assistant:

StreamIn* TY_(FileInput)( TidyDocImpl* doc, FILE *fp, int encoding )
{
    StreamIn *in = TY_(initStreamIn)( doc, encoding );
    if ( TY_(initFileSource)( doc->allocator, &in->source, fp ) != 0 )
    {
        TY_(freeStreamIn)( in );
        return NULL;
    }
    in->iotype = FileIO;
    return in;
}